

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O3

void __thiscall QFontComboBox::QFontComboBox(QFontComboBox *this,QWidget *parent)

{
  QFontComboBoxPrivate *comboP;
  void **ppvVar1;
  void *pvVar2;
  void **ppvVar3;
  QComboBoxPrivate *this_00;
  QStringListModel *this_01;
  QFontFamilyDelegate *this_02;
  QListView *this_03;
  undefined4 *puVar4;
  unsigned_long __i0;
  long lVar5;
  long in_FS_OFFSET;
  code *local_68;
  ImplFn local_60;
  code *local_58;
  undefined8 local_50;
  Connection local_48;
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QComboBoxPrivate *)operator_new(0x390);
  QComboBoxPrivate::QComboBoxPrivate(this_00);
  *(undefined ***)&this_00->super_QWidgetPrivate = &PTR__QFontComboBoxPrivate_007f3250;
  *(undefined4 *)&this_00[1].super_QWidgetPrivate = 0;
  QFont::QFont((QFont *)&this_00[1].super_QWidgetPrivate.field_0x8);
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x18 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x20 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x28 = 0;
  lVar5 = 0x380;
  do {
    QMetaObject::Connection::Connection
              ((Connection *)(&(this_00->super_QWidgetPrivate).super_QObjectPrivate + lVar5));
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x390);
  QComboBox::QComboBox(&this->super_QComboBox,this_00,parent);
  *(undefined ***)&(this->super_QComboBox).super_QWidget = &PTR_metaObject_007f2f30;
  *(undefined ***)&(this->super_QComboBox).super_QWidget.super_QPaintDevice =
       &PTR__QFontComboBox_007f3100;
  comboP = *(QFontComboBoxPrivate **)&(this->super_QComboBox).super_QWidget.field_0x8;
  QFont::operator=(&comboP->currentFont,&((this->super_QComboBox).super_QWidget.data)->fnt);
  QComboBox::setEditable(&this->super_QComboBox,true);
  this_01 = (QStringListModel *)operator_new(0x28);
  QStringListModel::QStringListModel(this_01,(QObject *)this);
  (**(code **)(*(long *)&(this->super_QComboBox).super_QWidget + 0x1a0))(this,this_01);
  this_02 = (QFontFamilyDelegate *)operator_new(0x30);
  QFontFamilyDelegate::QFontFamilyDelegate(this_02,(QObject *)this,comboP);
  QComboBox::setItemDelegate(&this->super_QComboBox,(QAbstractItemDelegate *)this_02);
  QComboBox::view(&this->super_QComboBox);
  this_03 = (QListView *)QMetaObject::cast((QObject *)&QListView::staticMetaObject);
  if (this_03 != (QListView *)0x0) {
    QListView::setUniformItemSizes(this_03,true);
  }
  lVar5 = 0;
  setWritingSystem(this,Any);
  local_58 = QComboBox::currentTextChanged;
  local_50 = 0;
  local_68 = QFontComboBoxPrivate::currentChanged;
  local_60 = (ImplFn)0x0;
  ppvVar1 = *(void ***)&(comboP->super_QComboBoxPrivate).super_QWidgetPrivate.field_0x8;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QFontComboBoxPrivate::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(code **)(puVar4 + 4) = QFontComboBoxPrivate::currentChanged;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_48,(void **)this,(QObject *)&local_58,ppvVar1,
             (QSlotObjectBase *)&local_68,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  ppvVar3 = QCoreApplication::self;
  local_58 = QGuiApplication::fontDatabaseChanged;
  local_50 = 0;
  local_68 = QFontComboBoxPrivate::updateModel;
  local_60 = (ImplFn)0x0;
  ppvVar1 = *(void ***)&(comboP->super_QComboBoxPrivate).super_QWidgetPrivate.field_0x8;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QFontComboBoxPrivate::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(puVar4 + 4) = QFontComboBoxPrivate::updateModel;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_40,ppvVar3,(QObject *)&local_58,ppvVar1,(QSlotObjectBase *)&local_68,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  do {
    pvVar2 = (comboP->connections)._M_elems[lVar5].d_ptr;
    (comboP->connections)._M_elems[lVar5].d_ptr = (&local_48)[lVar5].d_ptr;
    (&local_48)[lVar5].d_ptr = pvVar2;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 2);
  lVar5 = 8;
  do {
    QMetaObject::Connection::~Connection((Connection *)((long)&local_48.d_ptr + lVar5));
    lVar5 = lVar5 + -8;
  } while (lVar5 != -8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFontComboBox::QFontComboBox(QWidget *parent)
    : QComboBox(*new QFontComboBoxPrivate, parent)
{
    Q_D(QFontComboBox);
    d->currentFont = font();
    setEditable(true);

    QStringListModel *m = new QStringListModel(this);
    setModel(m);
    setItemDelegate(new QFontFamilyDelegate(this, d));
    QListView *lview = qobject_cast<QListView*>(view());
    if (lview)
        lview->setUniformItemSizes(true);
    setWritingSystem(QFontDatabase::Any);

    d->connections = {
        QObjectPrivate::connect(this, &QFontComboBox::currentTextChanged,
                                d, &QFontComboBoxPrivate::currentChanged),
        QObjectPrivate::connect(qApp, &QGuiApplication::fontDatabaseChanged,
                                d, &QFontComboBoxPrivate::updateModel),
    };
}